

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retinaface.cpp
# Opt level: O1

void qsort_descent_inplace
               (vector<FaceObject,_std::allocator<FaceObject>_> *faceobjects,int left,int right)

{
  float fVar1;
  float fVar2;
  float fVar3;
  pointer pFVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ulong uVar8;
  int right_00;
  ulong uVar9;
  pointer pFVar10;
  Point2f *pPVar11;
  pointer pFVar12;
  Point2f *pPVar13;
  long lVar14;
  Point2f *pPVar15;
  uint uVar16;
  ulong uVar17;
  Point2f local_68 [7];
  float local_30;
  
  do {
    right_00 = right;
    uVar16 = left;
    if (left <= right) {
      pFVar4 = (faceobjects->super__Vector_base<FaceObject,_std::allocator<FaceObject>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar1 = pFVar4[(right + left) / 2].prob;
      uVar17 = (ulong)(uint)left;
      uVar9 = (ulong)(uint)right;
      do {
        uVar8 = (long)(int)uVar17;
        pPVar15 = pFVar4[(int)uVar17].landmark;
        do {
          pPVar11 = pPVar15;
          uVar17 = uVar8;
          fVar2 = pFVar4[uVar17].prob;
          uVar8 = uVar17 + 1;
          pPVar15 = (Point2f *)&pPVar11[7].y;
        } while (fVar1 < fVar2);
        pFVar10 = pFVar4 + uVar17;
        uVar8 = (long)(int)uVar9;
        pPVar15 = pFVar4[(int)uVar9].landmark;
        do {
          pPVar13 = pPVar15;
          uVar9 = uVar8;
          fVar3 = pFVar4[uVar9].prob;
          uVar8 = uVar9 - 1;
          pPVar15 = (Point2f *)&pPVar13[-8].y;
        } while (fVar3 < fVar1);
        if ((long)uVar17 <= (long)uVar9) {
          pFVar12 = pFVar4 + uVar9;
          local_68[0].x = (pFVar10->rect).x;
          local_68[0].y = (pFVar10->rect).y;
          local_68[1].x = (pFVar10->rect).width;
          local_68[1].y = (pFVar10->rect).height;
          lVar14 = 2;
          pPVar15 = pPVar11;
          do {
            local_68[lVar14] = *pPVar15;
            lVar14 = lVar14 + 1;
            pPVar15 = pPVar15 + 1;
          } while (lVar14 != 7);
          fVar5 = (pFVar12->rect).y;
          fVar6 = (pFVar12->rect).width;
          fVar7 = (pFVar12->rect).height;
          (pFVar10->rect).x = (pFVar12->rect).x;
          (pFVar10->rect).y = fVar5;
          (pFVar10->rect).width = fVar6;
          (pFVar10->rect).height = fVar7;
          lVar14 = 5;
          pPVar15 = pPVar13;
          do {
            *pPVar11 = *pPVar15;
            pPVar15 = pPVar15 + 1;
            pPVar11 = pPVar11 + 1;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
          pFVar10->prob = fVar3;
          (pFVar12->rect).x = local_68[0].x;
          (pFVar12->rect).y = local_68[0].y;
          (pFVar12->rect).width = (float)local_68[1].x;
          (pFVar12->rect).height = (float)local_68[1].y;
          lVar14 = 2;
          do {
            *pPVar13 = local_68[lVar14];
            lVar14 = lVar14 + 1;
            pPVar13 = pPVar13 + 1;
          } while (lVar14 != 7);
          pFVar12->prob = fVar2;
          uVar17 = (ulong)((int)uVar17 + 1);
          uVar9 = (ulong)((int)uVar9 - 1);
          local_30 = fVar2;
        }
        uVar16 = (uint)uVar17;
        right_00 = (int)uVar9;
      } while ((int)uVar16 <= right_00);
    }
    if (left < right_00) {
      qsort_descent_inplace(faceobjects,left,right_00);
    }
    left = uVar16;
  } while ((int)uVar16 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<FaceObject>& faceobjects, int left, int right)
{
    int i = left;
    int j = right;
    float p = faceobjects[(left + right) / 2].prob;

    while (i <= j)
    {
        while (faceobjects[i].prob > p)
            i++;

        while (faceobjects[j].prob < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(faceobjects[i], faceobjects[j]);

            i++;
            j--;
        }
    }

    #pragma omp parallel sections
    {
        #pragma omp section
        {
            if (left < j) qsort_descent_inplace(faceobjects, left, j);
        }
        #pragma omp section
        {
            if (i < right) qsort_descent_inplace(faceobjects, i, right);
        }
    }
}